

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  cmMakefile *this_00;
  cmSourceFile *pcVar1;
  bool bVar2;
  byte bVar3;
  TargetType TVar4;
  reference sourceName;
  cmCustomCommand *pcVar5;
  char *string;
  ostream *poVar6;
  string *psVar7;
  reference ppcVar8;
  cmSourceFileLocation *this_01;
  cmake *this_02;
  pair<std::_Rb_tree_const_iterator<cmSourceFile_*>,_bool> pVar9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  cmListFileBacktrace local_508;
  string local_4e8;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_4c8;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_4c0;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_4b8;
  const_iterator i_1;
  ostringstream e;
  undefined1 local_338 [8];
  SourceAndKind entry;
  undefined1 local_308 [8];
  string cppFileName;
  string hFileName_1;
  string xaml;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [8];
  string hFileName;
  string resx;
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  undefined1 local_1c8 [8];
  string ext;
  SourceKind kind;
  cmSourceFile *local_180;
  cmSourceFile *sf;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  const_iterator i;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  RegularExpression header_regex;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  string *config_local;
  KindedSources *files_local;
  cmGeneratorTarget *this_local;
  
  srcs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = config;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  GetSourceFiles(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_38,
                 srcs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)
             &badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::set
            ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)&i);
  local_170._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_168,&local_170);
  while( true ) {
    sf = (cmSourceFile *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38);
    bVar2 = __gnu_cxx::operator!=
                      (&local_168,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&sf);
    if (!bVar2) break;
    this_00 = this->Makefile;
    sourceName = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_168);
    local_180 = cmMakefile::GetOrCreateSource(this_00,sourceName,false);
    pVar9 = std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::
            insert((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
                    *)&i,&local_180);
    if (((pVar9.second ^ 0xffU) & 1) == 0) {
      psVar7 = cmSourceFile::GetExtension_abi_cxx11_(local_180);
      cmsys::SystemTools::LowerCase((string *)local_1c8,psVar7);
      pcVar5 = cmSourceFile::GetCustomCommand(local_180);
      if (pcVar5 == (cmCustomCommand *)0x0) {
        TVar4 = cmTarget::GetType(this->Target);
        pcVar1 = local_180;
        if (TVar4 == UTILITY) {
          ext.field_2._12_4_ = 4;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1e8,"HEADER_FILE_ONLY",&local_1e9);
          bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_1e8);
          std::__cxx11::string::~string((string *)&local_1e8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
          pcVar1 = local_180;
          if (bVar2) {
            ext.field_2._12_4_ = 5;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_210,"EXTERNAL_OBJECT",&local_211);
            bVar2 = cmSourceFile::GetPropertyAsBool(pcVar1,&local_210);
            std::__cxx11::string::~string((string *)&local_210);
            std::allocator<char>::~allocator((allocator<char> *)&local_211);
            if (bVar2) {
              ext.field_2._12_4_ = 3;
              TVar4 = GetType(this);
              if (TVar4 == OBJECT_LIBRARY) {
                std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                          ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                           &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_180);
              }
            }
            else {
              cmSourceFile::GetLanguage_abi_cxx11_((string *)((long)&resx.field_2 + 8),local_180);
              bVar3 = std::__cxx11::string::empty();
              std::__cxx11::string::~string((string *)(resx.field_2._M_local_buf + 8));
              if (((bVar3 ^ 0xff) & 1) == 0) {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_1c8,"def");
                if (bVar2) {
                  ext.field_2._12_4_ = 8;
                  TVar4 = GetType(this);
                  if (TVar4 == OBJECT_LIBRARY) {
                    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                              ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                               &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_180)
                    ;
                  }
                }
                else {
                  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_1c8,"idl");
                  if (bVar2) {
                    ext.field_2._12_4_ = 6;
                    TVar4 = GetType(this);
                    if (TVar4 == OBJECT_LIBRARY) {
                      std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                                ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                                 &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 &local_180);
                    }
                  }
                  else {
                    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_1c8,"resx");
                    if (bVar2) {
                      ext.field_2._12_4_ = 10;
                      psVar7 = cmSourceFile::GetFullPath(local_180,(string *)0x0);
                      std::__cxx11::string::string
                                ((string *)(hFileName.field_2._M_local_buf + 8),(string *)psVar7);
                      std::__cxx11::string::find_last_of
                                ((char)(&hFileName.field_2._M_allocated_capacity + 1),0x2e);
                      std::__cxx11::string::substr
                                ((ulong)&local_298,
                                 (ulong)(&hFileName.field_2._M_allocated_capacity + 1));
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_278,&local_298,".h");
                      std::__cxx11::string::~string((string *)&local_298);
                      std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert(&files->ExpectedResxHeaders,(value_type *)local_278);
                      std::__cxx11::string::~string((string *)local_278);
                      std::__cxx11::string::~string((string *)(hFileName.field_2._M_local_buf + 8));
                    }
                    else {
                      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_1c8,"appxmanifest");
                      if (bVar2) {
                        ext.field_2._12_4_ = 0;
                      }
                      else {
                        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_1c8,"manifest");
                        if (bVar2) {
                          ext.field_2._12_4_ = 7;
                        }
                        else {
                          bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1c8,"pfx");
                          if (bVar2) {
                            ext.field_2._12_4_ = 1;
                          }
                          else {
                            bVar2 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1c8,"xaml");
                            if (bVar2) {
                              ext.field_2._12_4_ = 0xb;
                              psVar7 = cmSourceFile::GetFullPath(local_180,(string *)0x0);
                              std::__cxx11::string::string
                                        ((string *)(hFileName_1.field_2._M_local_buf + 8),
                                         (string *)psVar7);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&cppFileName.field_2 + 8),
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&hFileName_1.field_2 + 8),".h");
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)local_308,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)((long)&hFileName_1.field_2 + 8),".cpp");
                              std::
                              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::insert(&files->ExpectedXamlHeaders,
                                       (value_type *)((long)&cppFileName.field_2 + 8));
                              pVar10 = std::
                                       set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ::insert(&files->ExpectedXamlSources,(value_type *)local_308)
                              ;
                              entry._8_8_ = pVar10.first._M_node;
                              std::__cxx11::string::~string((string *)local_308);
                              std::__cxx11::string::~string
                                        ((string *)(cppFileName.field_2._M_local_buf + 8));
                              std::__cxx11::string::~string
                                        ((string *)(hFileName_1.field_2._M_local_buf + 8));
                            }
                            else {
                              cmSourceFile::GetFullPath(local_180,(string *)0x0);
                              string = (char *)std::__cxx11::string::c_str();
                              bVar2 = cmsys::RegularExpression::find
                                                ((RegularExpression *)
                                                 &badObjLib.
                                                  super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                 ,string);
                              if (bVar2) {
                                ext.field_2._12_4_ = 5;
                              }
                              else {
                                ext.field_2._12_4_ = 4;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                ext.field_2._12_4_ = 9;
              }
            }
          }
        }
      }
      else {
        ext.field_2._12_4_ = 2;
      }
      local_338 = (undefined1  [8])local_180;
      entry.Source._0_4_ = ext.field_2._12_4_;
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      push_back(&files->Sources,(value_type *)local_338);
      std::__cxx11::string::~string((string *)local_1c8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_168);
  }
  bVar2 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::empty
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                     &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&i_1);
    poVar6 = std::operator<<((ostream *)&i_1,"OBJECT library \"");
    psVar7 = GetName_abi_cxx11_(this);
    poVar6 = std::operator<<(poVar6,(string *)psVar7);
    std::operator<<(poVar6,"\" contains:\n");
    local_4c0._M_current =
         (cmSourceFile **)
         std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                   ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                    &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __gnu_cxx::
    __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
    ::__normal_iterator<cmSourceFile**>
              ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                *)&local_4b8,&local_4c0);
    while( true ) {
      local_4c8._M_current =
           (cmSourceFile **)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
                      &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = __gnu_cxx::operator!=(&local_4b8,&local_4c8);
      if (!bVar2) break;
      poVar6 = std::operator<<((ostream *)&i_1,"  ");
      ppcVar8 = __gnu_cxx::
                __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                ::operator*(&local_4b8);
      this_01 = cmSourceFile::GetLocation(*ppcVar8);
      psVar7 = cmSourceFileLocation::GetName_abi_cxx11_(this_01);
      poVar6 = std::operator<<(poVar6,(string *)psVar7);
      std::operator<<(poVar6,"\n");
      __gnu_cxx::
      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
      ::operator++(&local_4b8);
    }
    std::operator<<((ostream *)&i_1,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    this_02 = cmGlobalGenerator::GetCMakeInstance(this->GlobalGenerator);
    std::__cxx11::ostringstream::str();
    GetBacktrace(&local_508,this);
    cmake::IssueMessage(this_02,FATAL_ERROR,&local_4e8,&local_508);
    cmListFileBacktrace::~cmListFileBacktrace(&local_508);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&i_1);
  }
  std::set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>::~set
            ((set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> *)&i);
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)
             &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  cmsys::RegularExpression::~RegularExpression
            ((RegularExpression *)
             &badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<std::string> srcs;
  this->GetSourceFiles(srcs, config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (std::vector<std::string>::const_iterator i = srcs.begin();
       i != srcs.end(); ++i) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath().c_str())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    SourceAndKind entry = { sf, kind };
    files.Sources.push_back(entry);
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (std::vector<cmSourceFile*>::const_iterator i = badObjLib.begin();
         i != badObjLib.end(); ++i) {
      e << "  " << (*i)->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}